

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
CHECK_BELLMAN_FORD(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *G,int *s,
                  WeightMap *weight,vector<unsigned_long,_std::allocator<unsigned_long>_> *pred,
                  vector<long,_std::allocator<long>_> *dist)

{
  pointer psVar1;
  pointer psVar2;
  pointer piVar3;
  value_type vVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  EdgeProperties *p;
  unsigned_long uVar8;
  _Elt_pointer puVar9;
  pointer puVar10;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
  *extraout_RDX;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
  *g_;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
  *extraout_RDX_00;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
  *extraout_RDX_01;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
  *g__00;
  int iVar11;
  long lVar12;
  size_type sVar13;
  unsigned_long u;
  reference rVar14;
  AdjList *cg;
  EdgeIterator ei;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> S;
  vector<bool,_std::allocator<bool>_> reachable;
  value_type local_b8;
  value_type local_a0;
  EdgeIterator *local_88;
  EdgeIterator *local_80;
  EdgeIterator ei_end;
  
  sVar13 = (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map._0_4_ = 4;
  g__00 = (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
           *)pred;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,sVar13,(value_type_conflict3 *)&S,(allocator_type *)&ei);
  S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map._0_4_ =
       (uint)S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_map & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&reachable,sVar13,(bool *)&S,(allocator_type *)&ei);
  dfs(G,s,&reachable);
  psVar1 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  g_ = extraout_RDX;
  for (sVar13 = 0; uVar8 = (unsigned_long)*s, (long)psVar1 - (long)psVar2 >> 5 != sVar13;
      sVar13 = sVar13 + 1) {
    if (sVar13 != uVar8) {
      uVar8 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar13];
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&reachable,sVar13);
      if ((sVar13 == uVar8) == ((*rVar14._M_p & rVar14._M_mask) != 0)) {
        __assert_fail("(pred[*v] == *v) == (reachable[*v] == false)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,0x8b,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&reachable,sVar13);
      g_ = (directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
            *)rVar14._M_mask;
      if ((*rVar14._M_p & (ulong)g_) == 0) {
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar13] = 1;
      }
    }
  }
  if ((pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar8] == uVar8) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8] = 0;
  }
  psVar1 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar8 != (long)psVar1 - (long)psVar2 >> 5; uVar8 = uVar8 + 1) {
    if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] == 4) {
      std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(&S);
      ei.vBegin.m_value = uVar8;
      while( true ) {
        piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = piVar3[ei.vBegin.m_value];
        if (iVar11 != 4) break;
        piVar3[ei.vBegin.m_value] = 3;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&S,
                   (value_type_conflict1 *)&ei);
        ei.vBegin.m_value =
             (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[ei.vBegin.m_value];
      }
      if (iVar11 == 3) {
        do {
          puVar9 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            puVar9 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          vVar4 = puVar9[-1];
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&S);
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[vVar4] = 2;
        } while (vVar4 != ei.vBegin.m_value);
        while (S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) {
          puVar9 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            puVar9 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[puVar9[-1]] = -1;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&S);
        }
      }
      else {
        if (iVar11 == 2) {
          iVar11 = -1;
        }
        while (S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) {
          puVar9 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            puVar9 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[puVar9[-1]] = iVar11;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&S);
        }
      }
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&S);
      g_ = extraout_RDX_00;
    }
  }
  psVar1 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar8 != (long)psVar1 - (long)psVar2 >> 5; uVar8 = uVar8 + 1) {
    if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] == 2) {
      puVar10 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = 0;
      u = uVar8;
      do {
        boost::
        edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> *)
                   &S,(boost *)puVar10[u],u,(vertex_descriptor)G,g__00);
        lVar12 = lVar12 + *(int *)((long)S.c.
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_cur +
                                  weight->tag);
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[u] = -2;
        puVar10 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        u = puVar10[u];
      } while (u != uVar8);
      g_ = extraout_RDX_01;
      if (-1 < lVar12) {
        __assert_fail("cycle_length < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,0xbc,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
    }
  }
  if (((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[*s] == 0) &&
     ((dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[*s] != 0)) {
    __assert_fail("dist[s] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                  ,0xc0,
                  "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                 );
  }
  ei.vEnd.m_value._0_1_ = 0;
  ei._17_8_ = 0;
  ei.vBegin.m_value = 0;
  ei.vCurr.m_value._0_1_ = 0;
  ei.vCurr.m_value._1_7_ = 0;
  ei_end.vEnd.m_value._0_1_ = 0;
  ei_end._17_8_ = 0;
  ei_end.vBegin.m_value = 0;
  ei_end.vCurr.m_value._0_1_ = 0;
  ei_end.vCurr.m_value._1_7_ = 0;
  boost::
  edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>
            ((pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
              *)&S,(boost *)G,g_);
  local_88 = &ei;
  local_80 = &ei_end;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_88,
              (pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
               *)&S);
  do {
    bVar7 = boost::detail::
            adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
            ::operator!=(&ei,&ei_end);
    if (!bVar7) {
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&reachable.super__Bvector_base<std::allocator<bool>_>);
      return __return_storage_ptr__;
    }
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*((value_type *)&S,&ei);
    lVar12 = CONCAT44(S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_map._4_4_,
                      (uint)S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Deque_impl_data._M_map);
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*((value_type *)&S,&ei);
    sVar6 = S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_map_size;
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar3[S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_map_size] == 0) {
      iVar11 = piVar3[lVar12];
      if (iVar11 == 0) {
        lVar5 = (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar12];
        boost::detail::
        adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
        ::operator*(&local_a0,&ei);
        if (lVar5 + *(int *)((long)local_a0.m_eproperty + weight->tag) <
            (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_start[sVar6]) {
          __assert_fail("dist[v] + weight[*ei] >= dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xca,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
        boost::detail::
        adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
        ::operator*((value_type *)&S,&ei);
        if ((CONCAT44(S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_map._4_4_,
                      (uint)S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Deque_impl_data._M_map) ==
             (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[sVar6]) &&
           (lVar12 = (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar12],
           boost::detail::
           adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
           ::operator*(&local_b8,&ei),
           lVar12 + *(int *)((long)local_b8.m_eproperty + weight->tag) !=
           (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start[sVar6])) {
          __assert_fail("dist[v] + weight[*ei] == dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xce,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
      }
      else if (iVar11 != 1) {
        __assert_fail("label[v] == FINITE || label[v] == PLUS",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,199,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
    }
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator++(&ei);
  } while( true );
}

Assistant:

std::vector<int> CHECK_BELLMAN_FORD(const Graph& G, const int& s, const WeightMap& weight, std::vector<unsigned long>& pred, std::vector<long>& dist)
{
    // init
    unsigned long  n_vertices = num_vertices(G);
    enum{ NEG_CYCLE = -2, ATT_TO_CYCLE = -1, FINITE = 0, PLUS = 1, CYCLE = 2, ON_CUR_PATH = 3, UNKNOWN = 4 };
    std::vector<int> label(n_vertices, UNKNOWN);
    std::vector<bool> reachable(n_vertices, false);

    dfs(G,s,reachable);
    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if (*v != s) {
            // if v in V+, their is a path s-v
            assert( (pred[*v] == *v) == (reachable[*v] == false));
            if (reachable[*v] == false) label[*v]=PLUS;
        }
    }

    // classification of nodes
    if (pred[s]==s) label[s]=FINITE;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if(label[*v]==UNKNOWN) {
            std::stack<Vertex> S;
            Vertex w = *v;
            while (label[w]==UNKNOWN) {
                label[w]=ON_CUR_PATH;
                S.push(w);
                w = pred[w];
            }
            // label all nodes on current path
            int t = label[w];
            if ( t == ON_CUR_PATH ) {
                Vertex z;
                do { 
                    z = S.top(); S.pop();
                    label[z] = CYCLE;
                } while ( z != w );

                while ( !S.empty() ) {
                    label[S.top()] = ATT_TO_CYCLE;
                    S.pop();
                }
            } else { // t is CYCLE, ATT_TO_CYCLE, or FINITE
                if ( t == CYCLE ) t = ATT_TO_CYCLE;
                while ( !S.empty() ) {
                    label[S.top()] = t;
                    S.pop();
                }
            }
        }
    }

    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
         if ( label[*v] == CYCLE ){
            Vertex w = *v;
            long cycle_length = 0;
            do { 
                cycle_length += weight[edge(pred[w], w, G).first];
                label[w] = NEG_CYCLE;
                w = pred[w];
            } while (w != *v);
            // All cycles in P have negative weight
            assert(cycle_length < 0);
         }
    }

    if ( label[s] == FINITE ) assert(dist[s] == 0);
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei){
        Vertex v = source(*ei, G);
        Vertex w = target(*ei, G);
        if ( label[w] == FINITE ) {
            // Their is no edge(v,w) where v in V- and w in Vf
            assert( label[v] == FINITE || label[v] == PLUS);
            // For each e(v,w) if v and w in Vf, dist[v] + weight[e] >= dist[w]
            if ( label[v] == FINITE ) {
                assert( dist[v] + weight[*ei] >= dist[w] );
                // For each vertex v in Vf,
                // If v=s then dist[v]=0
                // Else dist[v] = dist[u] + weight[edge(u,v)]
                if ( source(*ei, G) == pred[w] ) assert( dist[v] + weight[*ei] == dist[w] );
            }
        }
    }

    return label;
}